

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

void __thiscall Kernel::Signature::RealSymbol::RealSymbol(RealSymbol *this,RealConstantType *val)

{
  TermList TVar1;
  OperatorKey *key;
  OperatorType *type;
  char (*in_R8) [2];
  string local_38;
  
  if (*(int *)(Lib::env + 0x83d0) == 2) {
    Lib::Output::toString<char[10],Kernel::RealConstantType,char[2]>
              (&local_38,(Output *)"$to_real(",(char (*) [10])val,(RealConstantType *)0x8f7888,in_R8
              );
  }
  else {
    Lib::Output::toString<Kernel::RealConstantType>(&local_38,val);
  }
  Symbol::Symbol(&this->super_Symbol,&local_38,0,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  RealConstantType::RealConstantType(&this->_realValue,val);
  TVar1 = AtomicSort::realSort();
  key = OperatorType::setupKey(0,(TermList *)0x0);
  *(uint64_t *)(key + 8) = TVar1._content;
  type = OperatorType::getTypeFromKey(key,0);
  Symbol::setType(&this->super_Symbol,type);
  return;
}

Assistant:

RealSymbol(const RealConstantType& val)
    : Symbol((env.options->proof() == Shell::Options::Proof::PROOFCHECK) ? Output::toString("$to_real(",val,")") 
                                                                         : Output::toString(val),
        /*             arity */ 0, 
        /*       interpreted */ true, 
        /*    preventQuoting */ false, 
        /*             super */ false),
       _realValue(std::move(val))
    {
      setType(OperatorType::getConstantsType(AtomicSort::realSort()));
    }